

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

PrgBody * Clasp::Asp::PrgBody::create(LogicProgram *prg,uint32 id,Rule *r,uint32 pos,bool addDeps)

{
  bool bVar1;
  weight_t wVar2;
  size_t sVar3;
  long in_RDX;
  uint32 in_ESI;
  PrgBody *in_RDI;
  byte in_R8B;
  uint uVar4;
  LogicProgram *unaff_retaddr;
  uint32 in_stack_0000000c;
  PrgBody *in_stack_00000010;
  bool in_stack_0000001f;
  uint32 in_stack_00000020;
  bool in_stack_00000027;
  Sum_t *in_stack_00000028;
  LogicProgram *in_stack_00000030;
  size_t bytes_1;
  Sum_t *sum;
  size_t bytes;
  PrgBody *ret;
  PrgBody *in_stack_ffffffffffffff90;
  weight_t in_stack_ffffffffffffff98;
  uint32 in_stack_ffffffffffffff9c;
  PrgBody *in_stack_ffffffffffffffa0;
  PrgBody *local_28;
  undefined1 in_stack_fffffffffffffff3;
  
  bVar1 = Potassco::Rule_t::normal((Rule_t *)0x1a2242);
  if (!bVar1) {
    sVar3 = Potassco::size<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)(in_RDX + 0x20));
    in_stack_ffffffffffffff9c = in_ESI;
    in_stack_ffffffffffffffa0 = in_RDI;
    local_28 = (PrgBody *)operator_new(sVar3 * 4 + 0x20);
    Potassco::Body_t::operator_cast_to_unsigned_int((Body_t *)(in_RDX + 0x18));
    uVar4 = (uint)(in_R8B & 1);
    PrgBody((PrgBody *)sum,bytes_1._4_4_,in_stack_00000030,in_stack_00000028,in_stack_00000027,
            in_stack_00000020,in_stack_0000001f);
    wVar2 = bound((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (0 < wVar2) {
      in_stack_ffffffffffffff98 = sumW(in_stack_ffffffffffffff90);
      wVar2 = bound((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (wVar2 < in_stack_ffffffffffffff98) goto LAB_001a23b4;
    }
    Potassco::fail(-2,
                   "static PrgBody *Clasp::Asp::PrgBody::create(LogicProgram &, uint32, const Rule &, uint32, bool)"
                   ,0x2cf,"ret->bound() > 0 && ret->sumW() > ret->bound()","body not simplified",0,
                   uVar4);
  }
  sVar3 = Potassco::size<int>((Span<int> *)(in_RDX + 0x20));
  local_28 = (PrgBody *)operator_new(sVar3 * 4 + 0x18);
  PrgBody(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(LitSpan *)in_RDI,in_ESI,
          (bool)in_stack_fffffffffffffff3);
LAB_001a23b4:
  wVar2 = bound((PrgBody *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (wVar2 == 0) {
    assignValue(in_stack_ffffffffffffffa0,(ValueRep)(in_stack_ffffffffffffff9c >> 0x18));
    markDirty(local_28);
  }
  return local_28;
}

Assistant:

PrgBody* PrgBody::create(LogicProgram& prg, uint32 id, const Rule& r, uint32 pos, bool addDeps) {
	static_assert(sizeof(PrgBody) == 24 && sizeof(Agg) == sizeof(void*), "unexpected alignment");
	PrgBody* ret = 0;
	if (r.normal()) {
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.cond) * sizeof(Literal));
		ret = new (::operator new(bytes)) PrgBody(id, prg, r.cond, pos, addDeps);
	}
	else {
		const Potassco::Sum_t& sum = r.agg;
		size_t bytes = sizeof(PrgBody) + (Potassco::size(r.agg.lits) * sizeof(Literal)) + sizeof(Agg);
		ret = new (::operator new(bytes)) PrgBody(id, prg, sum, r.bt == Body_t::Sum, pos, addDeps);
		POTASSCO_REQUIRE(ret->bound() > 0 && ret->sumW() > ret->bound(), "body not simplified");
	}
	if (ret->bound() == 0) {
		ret->assignValue(value_true);
		ret->markDirty();
	}
	return ret;
}